

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFPageDocumentHelper::addPageAt
          (QPDFPageDocumentHelper *this,QPDFPageObjectHelper *newpage,bool before,
          QPDFPageObjectHelper *refpage)

{
  QPDF *this_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (this->super_QPDFDocumentHelper).qpdf;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(newpage->super_QPDFObjectHelper).super_BaseHandle);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(refpage->super_QPDFObjectHelper).super_BaseHandle);
  QPDF::addPageAt(this_00,(QPDFObjectHandle *)&local_38,before,(QPDFObjectHandle *)&_Stack_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void
QPDFPageDocumentHelper::addPageAt(
    QPDFPageObjectHelper newpage, bool before, QPDFPageObjectHelper refpage)
{
    this->qpdf.addPageAt(newpage.getObjectHandle(), before, refpage.getObjectHandle());
}